

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::LogButtons(void)

{
  bool bVar1;
  byte bVar2;
  bool log_to_clipboard;
  bool log_to_file;
  bool log_to_tty;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd4;
  undefined7 in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffe0;
  float in_stack_ffffffffffffffe4;
  ImVec2 local_14;
  byte local_9;
  ImGuiContext *local_8;
  
  local_8 = GImGui;
  PushID((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  ImVec2::ImVec2(&local_14,0.0,0.0);
  local_9 = Button((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffc8);
  SameLine(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffe0,0.0,0.0);
  bVar1 = Button((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffc8);
  SameLine(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd4,0.0,0.0);
  bVar2 = Button((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffc8);
  SameLine(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
  PushItemWidth(in_stack_ffffffffffffffd4);
  PushAllowKeyboardFocus(false);
  SliderInt((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
            (int *)CONCAT17(bVar2,in_stack_ffffffffffffffd8),(int)in_stack_ffffffffffffffd4,
            (int)in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
  PopAllowKeyboardFocus();
  PopItemWidth();
  PopID();
  if ((local_9 & 1) != 0) {
    LogToTTY(local_8->LogAutoExpandMaxDepth);
  }
  if (bVar1) {
    LogToFile((int)in_stack_ffffffffffffffe4,(char *)CONCAT17(bVar2,in_stack_ffffffffffffffd8));
  }
  if ((bVar2 & 1) != 0) {
    LogToClipboard(local_8->LogAutoExpandMaxDepth);
  }
  return;
}

Assistant:

void ImGui::LogButtons()
{
    ImGuiContext& g = *GImGui;

    PushID("LogButtons");
    const bool log_to_tty = Button("Log To TTY"); SameLine();
    const bool log_to_file = Button("Log To File"); SameLine();
    const bool log_to_clipboard = Button("Log To Clipboard"); SameLine();
    PushItemWidth(80.0f);
    PushAllowKeyboardFocus(false);
    SliderInt("Depth", &g.LogAutoExpandMaxDepth, 0, 9, NULL);
    PopAllowKeyboardFocus();
    PopItemWidth();
    PopID();

    // Start logging at the end of the function so that the buttons don't appear in the log
    if (log_to_tty)
        LogToTTY(g.LogAutoExpandMaxDepth);
    if (log_to_file)
        LogToFile(g.LogAutoExpandMaxDepth, g.IO.LogFilename);
    if (log_to_clipboard)
        LogToClipboard(g.LogAutoExpandMaxDepth);
}